

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O1

_Bool Curl_uint_tbl_next(uint_tbl *tbl,uint last_key,uint *pkey,void **pentry)

{
  uint uVar1;
  _Bool _Var2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (pentry == (void **)0x0 || pkey == (uint *)0x0) {
    _Var2 = false;
  }
  else {
    uVar4 = last_key + 1;
    uVar1 = tbl->nrows;
    uVar6 = (ulong)uVar1;
    bVar7 = uVar4 < uVar1;
    if (uVar4 < uVar1) {
      uVar5 = (ulong)uVar4;
      pvVar3 = tbl->rows[uVar5];
      _Var2 = true;
      if (pvVar3 != (void *)0x0) goto LAB_00162530;
      do {
        uVar5 = uVar5 + 1;
        if (uVar6 == uVar5) {
          bVar7 = uVar5 < uVar6;
          goto LAB_00162518;
        }
        pvVar3 = tbl->rows[uVar5];
        uVar4 = uVar4 + 1;
      } while (pvVar3 == (void *)0x0);
      bVar7 = uVar5 < uVar6;
    }
    else {
LAB_00162518:
      pvVar3 = (void *)0x0;
      uVar4 = 0xffffffff;
    }
    *pkey = uVar4;
    *pentry = pvVar3;
    _Var2 = true;
    if (!bVar7) {
      pvVar3 = (void *)0x0;
      _Var2 = false;
      uVar4 = 0xffffffff;
LAB_00162530:
      *pkey = uVar4;
      *pentry = pvVar3;
      return _Var2;
    }
  }
  return _Var2;
}

Assistant:

bool Curl_uint_tbl_next(struct uint_tbl *tbl, unsigned int last_key,
                        unsigned int *pkey, void **pentry)
{
  if(!pkey || !pentry)
    return FALSE;
  if(uint_tbl_next_at(tbl, last_key + 1, pkey, pentry))
    return TRUE;
  *pkey = UINT_MAX;  /* always invalid */
  *pentry = NULL;
  return FALSE;
}